

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseElementEnd(xmlParserCtxtPtr ctxt)

{
  xmlNodePtr pxVar1;
  void **ppvVar2;
  xmlParserInputPtr pxVar3;
  ulong uVar4;
  int in_ESI;
  int in_R8D;
  int in_R9D;
  xmlParserNodeInfo node_info;
  xmlParserNodeInfo local_38;
  
  uVar4 = (ulong)(uint)ctxt->nameNr;
  if (0 < ctxt->nameNr) {
    pxVar1 = ctxt->node;
    if (ctxt->sax2 == 0) {
      xmlParseEndTag1(ctxt,in_ESI);
    }
    else {
      ppvVar2 = ctxt->pushTab;
      xmlParseEndTag2(ctxt,(xmlChar *)ppvVar2[uVar4 * 3 + -3],(xmlChar *)ppvVar2[uVar4 * 3 + -2],
                      *(int *)(ppvVar2 + uVar4 * 3 + -1),in_R8D,in_R9D);
      namePop(ctxt);
    }
    if ((pxVar1 != (xmlNodePtr)0x0) && (ctxt->record_info != 0)) {
      pxVar3 = ctxt->input;
      local_38.end_pos = (unsigned_long)(pxVar3->cur + (pxVar3->consumed - (long)pxVar3->base));
      local_38.end_line = (unsigned_long)pxVar3->line;
      local_38.node = pxVar1;
      xmlParserAddNodeInfo(ctxt,&local_38);
    }
  }
  return;
}

Assistant:

static void
xmlParseElementEnd(xmlParserCtxtPtr ctxt) {
    xmlParserNodeInfo node_info;
    xmlNodePtr ret = ctxt->node;

    if (ctxt->nameNr <= 0)
        return;

    /*
     * parse the end of tag: '</' should be here.
     */
    if (ctxt->sax2) {
        const xmlChar *prefix = ctxt->pushTab[ctxt->nameNr * 3 - 3];
        const xmlChar *URI = ctxt->pushTab[ctxt->nameNr * 3 - 2];
        int nsNr = (ptrdiff_t) ctxt->pushTab[ctxt->nameNr * 3 - 1];
	xmlParseEndTag2(ctxt, prefix, URI, 0, nsNr, 0);
	namePop(ctxt);
    }
#ifdef LIBXML_SAX1_ENABLED
    else
	xmlParseEndTag1(ctxt, 0);
#endif /* LIBXML_SAX1_ENABLED */

    /*
     * Capture end position and add node
     */
    if ( ret != NULL && ctxt->record_info ) {
       node_info.end_pos = ctxt->input->consumed +
                          (CUR_PTR - ctxt->input->base);
       node_info.end_line = ctxt->input->line;
       node_info.node = ret;
       xmlParserAddNodeInfo(ctxt, &node_info);
    }
}